

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O3

void __thiscall serialize_tests::with_params_derived::test_method(with_params_derived *this)

{
  int iVar1;
  iterator pvVar2;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  lazy_ostream local_158;
  undefined1 *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  DataStream stream;
  char *local_f8;
  undefined **local_f0;
  undefined1 local_e8;
  undefined1 *local_e0;
  char **local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  undefined **local_c8;
  DataStream *local_c0;
  undefined1 *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_b0;
  char *local_a8;
  char *local_a0;
  assertion_result local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_60[0] = 0xf;
  pvVar2 = (iterator)0x2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&local_58,0,0,"xY",2);
  stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  stream.m_read_pos = 0;
  stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8 = (undefined **)&RAW_LOWER;
  local_c0 = &stream;
  Derived::
  SerializationOps<ParamsStream<DataStream&,serialize_tests::DerivedAndBaseFormat>,serialize_tests::Derived_const,ActionSerialize>
            (local_60);
  local_c8 = (undefined **)&HEX_UPPER;
  local_c0 = &stream;
  Derived::
  SerializationOps<ParamsStream<DataStream&,serialize_tests::DerivedAndBaseFormat>,serialize_tests::Derived_const,ActionSerialize>
            (local_60,&local_c8);
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1f0;
  file.m_begin = (iterator)&local_128;
  msg.m_end = in_R9;
  msg.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_138,msg);
  local_158.m_empty = false;
  local_158._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_148 = boost::unit_test::lazy_ostream::inst;
  local_140 = "";
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<unsigned_char_const*>
            ((string *)&local_80,
             stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_start + stream.m_read_pos,
             stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_finish);
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_80,"\x0f\x02xy0f\x02XY");
  local_98.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_98.m_message.px = (element_type *)0x0;
  local_98.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_a0 = "";
  local_b0 = &local_d0;
  local_c0 = (DataStream *)((ulong)local_c0 & 0xffffffffffffff00);
  local_c8 = &PTR__lazy_ostream_013ae148;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_d8 = &local_f8;
  local_f8 = "\x0f\x02xy0f\x02XY";
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_013ae8d8;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_80;
  boost::test_tools::tt_detail::report_assertion
            (&local_98,&local_158,1,2,REQUIRE,0xf10851,(size_t)&local_a8,0x1f0,&local_c8,
             "\"\\x0F\\x02xy\" \"0f\\x02XY\"",&local_f0);
  boost::detail::shared_count::~shared_count(&local_98.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(with_params_derived)
{
    Derived d;
    d.m_base_data = 0x0F;
    d.m_derived_data = "xY";

    DataStream stream;

    stream << RAW_LOWER(d);

    stream << HEX_UPPER(d);

    BOOST_CHECK_EQUAL(stream.str(), "\x0F\x02xy"
                                    "0f\x02XY");
}